

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

MPP_RET mpi_enc_gen_osd_data
                  (MppEncOSDData *osd_data,MppBufferGroup group,RK_U32 width,RK_U32 height,
                  RK_U32 frame_cnt)

{
  uint uVar1;
  long lVar3;
  uint uVar4;
  int __c;
  MppBuffer pvVar5;
  uint uVar6;
  RK_U32 region_size;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  RK_U32 *pRVar15;
  MppBuffer buf;
  MppBuffer local_50;
  ulong local_48;
  ulong local_40;
  MppBufferGroup local_38;
  ulong uVar2;
  
  uVar7 = width + 0xf >> 4;
  uVar1 = height + 0xf >> 4;
  uVar2 = (ulong)uVar1;
  uVar14 = uVar7 + 7 >> 3;
  uVar9 = uVar1 + 0xf >> 4;
  uVar4 = 0;
  uVar13 = (ulong)(uVar14 * frame_cnt) % (ulong)uVar7;
  uVar11 = (ulong)(frame_cnt * uVar9) % uVar2;
  buf = osd_data->buf;
  uVar1 = 0;
  pvVar5 = buf;
  local_38 = group;
  if (buf != (MppBuffer)0x0) {
    local_50 = buf;
    local_48 = (ulong)uVar7;
    local_40 = uVar2;
    uVar1 = mpp_buffer_get_size_with_caller(buf,"mpi_enc_gen_osd_data");
    uVar7 = (uint)local_48;
    uVar2 = local_40;
    pvVar5 = local_50;
  }
  osd_data->num_region = 8;
  for (lVar3 = 0x24; (int)lVar3 != 0x104; lVar3 = lVar3 + 0x1c) {
    *(int *)((long)(osd_data->region + -1) + lVar3) = (int)uVar13;
    *(int *)((long)osd_data->region + lVar3 + -0x18) = (int)uVar11;
    *(uint *)((long)osd_data->region + lVar3 + -0x14) = uVar14;
    *(uint *)((long)osd_data->region + lVar3 + -0x10) = uVar9;
    *(uint *)((long)osd_data->region + lVar3 + -0xc) = uVar4;
    *(undefined8 *)((long)osd_data->region + lVar3 + -0x24) = 0x100000001;
    uVar12 = (int)uVar13 + uVar14;
    uVar6 = 0;
    if (uVar7 <= uVar12) {
      uVar6 = uVar7;
    }
    uVar10 = (int)uVar11 + uVar9;
    uVar8 = 0;
    if ((uint)uVar2 <= uVar10) {
      uVar8 = (uint)uVar2;
    }
    uVar4 = uVar4 + uVar14 * uVar9 * 0x100;
    uVar13 = (ulong)(uVar12 - uVar6);
    uVar11 = (ulong)(uVar10 - uVar8);
  }
  if (uVar1 < uVar4) {
    if (pvVar5 != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(pvVar5,"mpi_enc_gen_osd_data");
    }
    mpp_buffer_get_with_tag(local_38,&buf,uVar4,"mpi_enc_utils","mpi_enc_gen_osd_data");
    pvVar5 = buf;
    if (buf == (MppBuffer)0x0) {
      _mpp_log_l(2,"mpi_enc_utils","failed to create osd buffer size %d\n","mpi_enc_gen_osd_data",
                 uVar4);
      pvVar5 = buf;
      goto LAB_0010bbc8;
    }
  }
  else {
LAB_0010bbc8:
    if (pvVar5 == (MppBuffer)0x0) {
      buf = (MppBuffer)0x0;
      goto LAB_0010bc10;
    }
  }
  lVar3 = mpp_buffer_get_ptr_with_caller(pvVar5,"mpi_enc_gen_osd_data");
  pRVar15 = &osd_data->region[0].buf_offset;
  for (__c = 0; __c != 8; __c = __c + 1) {
    memset((void *)((ulong)*pRVar15 + lVar3),__c,(ulong)(pRVar15[-2] * pRVar15[-1] * 0x100));
    pRVar15 = pRVar15 + 7;
  }
LAB_0010bc10:
  osd_data->buf = buf;
  return MPP_OK;
}

Assistant:

MPP_RET mpi_enc_gen_osd_data(MppEncOSDData *osd_data, MppBufferGroup group,
                             RK_U32 width, RK_U32 height, RK_U32 frame_cnt)
{
    MppEncOSDRegion *region = NULL;
    RK_U32 k = 0;
    RK_U32 num_region = 8;
    RK_U32 buf_offset = 0;
    RK_U32 buf_size = 0;
    RK_U32 mb_w_max = MPP_ALIGN(width, 16) / 16;
    RK_U32 mb_h_max = MPP_ALIGN(height, 16) / 16;
    RK_U32 step_x = MPP_ALIGN(mb_w_max, 8) / 8;
    RK_U32 step_y = MPP_ALIGN(mb_h_max, 16) / 16;
    RK_U32 mb_x = (frame_cnt * step_x) % mb_w_max;
    RK_U32 mb_y = (frame_cnt * step_y) % mb_h_max;
    RK_U32 mb_w = step_x;
    RK_U32 mb_h = step_y;
    MppBuffer buf = osd_data->buf;

    if (buf)
        buf_size = mpp_buffer_get_size(buf);

    /* generate osd region info */
    osd_data->num_region = num_region;

    region = osd_data->region;

    for (k = 0; k < num_region; k++, region++) {
        // NOTE: offset must be 16 byte aligned
        RK_U32 region_size = MPP_ALIGN(mb_w * mb_h * 256, 16);

        region->inverse = 1;
        region->start_mb_x = mb_x;
        region->start_mb_y = mb_y;
        region->num_mb_x = mb_w;
        region->num_mb_y = mb_h;
        region->buf_offset = buf_offset;
        region->enable = (mb_w && mb_h);

        buf_offset += region_size;

        mb_x += step_x;
        mb_y += step_y;
        if (mb_x >= mb_w_max)
            mb_x -= mb_w_max;
        if (mb_y >= mb_h_max)
            mb_y -= mb_h_max;
    }

    /* create buffer and write osd index data */
    if (buf_size < buf_offset) {
        if (buf)
            mpp_buffer_put(buf);

        mpp_buffer_get(group, &buf, buf_offset);
        if (NULL == buf)
            mpp_err_f("failed to create osd buffer size %d\n", buf_offset);
    }

    if (buf) {
        void *ptr = mpp_buffer_get_ptr(buf);
        region = osd_data->region;

        for (k = 0; k < num_region; k++, region++) {
            mb_w = region->num_mb_x;
            mb_h = region->num_mb_y;
            buf_offset = region->buf_offset;

            memset(ptr + buf_offset, k, mb_w * mb_h * 256);
        }
    }

    osd_data->buf = buf;

    return MPP_OK;
}